

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCase.cpp
# Opt level: O1

void __thiscall
xe::TestNode::TestNode(TestNode *this,TestGroup *parent,TestNodeType nodeType,char *name,char *desc)

{
  TestGroup *pTVar1;
  iterator iVar2;
  runtime_error *this_00;
  long *plVar3;
  size_type *psVar4;
  undefined1 local_d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  size_type *local_90;
  long local_88;
  size_type local_80;
  long lStack_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  string local_50;
  
  this->_vptr_TestNode = (_func_int **)&PTR__TestNode_00127cb0;
  this->m_parent = parent;
  this->m_nodeType = nodeType;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_name,name,(allocator<char> *)local_d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_description,desc,(allocator<char> *)local_d0);
  if (this->m_parent != (TestGroup *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_d0,name,(allocator<char> *)&local_b0);
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&(parent->m_childNames)._M_t,(key_type *)local_d0);
    if ((TestNode *)local_d0._0_8_ != (TestNode *)(local_d0 + 0x10)) {
      operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
    }
    if ((_Rb_tree_header *)iVar2._M_node !=
        &(parent->m_childNames)._M_t._M_impl.super__Rb_tree_header) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"Duplicate node \'","");
      plVar3 = (long *)std::__cxx11::string::append((char *)local_70);
      local_90 = (size_type *)*plVar3;
      psVar4 = (size_type *)(plVar3 + 2);
      if (local_90 == psVar4) {
        local_80 = *psVar4;
        lStack_78 = plVar3[3];
        local_90 = &local_80;
      }
      else {
        local_80 = *psVar4;
      }
      local_88 = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_90);
      local_b0._M_dataplus._M_p = (pointer)*plVar3;
      psVar4 = (size_type *)(plVar3 + 2);
      if ((size_type *)local_b0._M_dataplus._M_p == psVar4) {
        local_b0.field_2._M_allocated_capacity = *psVar4;
        local_b0.field_2._8_8_ = plVar3[3];
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      }
      else {
        local_b0.field_2._M_allocated_capacity = *psVar4;
      }
      local_b0._M_string_length = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      getFullPath_abi_cxx11_(&local_50,&parent->super_TestNode);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                     &local_b0,&local_50);
      std::runtime_error::runtime_error(this_00,(string *)local_d0);
      *(undefined ***)this_00 = &PTR__runtime_error_00127038;
      __cxa_throw(this_00,&Error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_d0._0_8_ = this;
    std::vector<xe::TestNode*,std::allocator<xe::TestNode*>>::emplace_back<xe::TestNode*>
              ((vector<xe::TestNode*,std::allocator<xe::TestNode*>> *)&this->m_parent->m_children,
               (TestNode **)local_d0);
    pTVar1 = this->m_parent;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_d0,name,(allocator<char> *)&local_b0);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&pTVar1->m_childNames,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0);
    if ((TestNode *)local_d0._0_8_ != (TestNode *)(local_d0 + 0x10)) {
      operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
    }
  }
  return;
}

Assistant:

TestNode::TestNode (TestGroup* parent, TestNodeType nodeType, const char* name, const char* desc)
	: m_parent		(parent)
	, m_nodeType	(nodeType)
	, m_name		(name)
	, m_description	(desc)
{
	if (m_parent)
	{
		// Verify that the name is unique.
		if (parent->m_childNames.find(name) != parent->m_childNames.end())
			throw Error(std::string("Duplicate node '") + name + "' in '" + parent->getFullPath());

		m_parent->m_children.push_back(this);
		m_parent->m_childNames.insert(name);
	}
}